

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O1

bool __thiscall QRhiWidgetPrivate::invokeInitialize(QRhiWidgetPrivate *this,QRhiCommandBuffer *cb)

{
  QRhiTexture *pQVar1;
  long *plVar2;
  undefined8 uVar3;
  char cVar4;
  QRhiRenderBuffer *pQVar5;
  QRhiTextureRenderTarget *pQVar6;
  QRhiRenderPassDescriptor *pQVar7;
  QRhiTexture *pQVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QRhiColorAttachment color0;
  QRhiTextureRenderTargetDescription rtDesc;
  undefined8 local_220;
  QRhiColorAttachment local_218;
  long local_1e0 [2];
  undefined1 *local_1d0;
  undefined1 local_1c8 [416];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->colorTexture;
  if (pQVar1 == (QRhiTexture *)0x0 && (QRhiTexture *)this->msaaColorBuffer == (QRhiTexture *)0x0) {
LAB_002efad9:
    bVar9 = false;
  }
  else {
    plVar2 = *(long **)&(this->super_QWidgetPrivate).field_0x8;
    if (this->autoRenderTarget == true) {
      pQVar8 = (QRhiTexture *)this->msaaColorBuffer;
      if (pQVar1 != (QRhiTexture *)0x0) {
        pQVar8 = pQVar1;
      }
      uVar3 = *(undefined8 *)(pQVar8 + 0x34);
      pQVar5 = this->depthStencilBuffer;
      local_220 = uVar3;
      if (pQVar5 == (QRhiRenderBuffer *)0x0) {
        pQVar5 = (QRhiRenderBuffer *)QRhi::newRenderBuffer(this->rhi,0,&local_220,this->samples,0,0)
        ;
        this->depthStencilBuffer = pQVar5;
        cVar4 = (**(code **)(*(long *)pQVar5 + 0x20))(pQVar5);
        if (cVar4 == '\0') {
          invokeInitialize(this);
          goto LAB_002efad9;
        }
      }
      else {
        local_220._0_4_ = (int)uVar3;
        if (((int)local_220 != (int)*(undefined8 *)(pQVar5 + 0x34)) ||
           (local_220._4_4_ = (int)((ulong)uVar3 >> 0x20),
           bVar9 = local_220._4_4_ != (int)((ulong)*(undefined8 *)(pQVar5 + 0x34) >> 0x20), bVar9))
        {
          *(undefined8 *)(pQVar5 + 0x34) = uVar3;
          cVar4 = (**(code **)(*(long *)this->depthStencilBuffer + 0x20))();
          if (cVar4 == '\0') {
            invokeInitialize();
            goto LAB_002efad9;
          }
        }
      }
      if (this->renderTarget == (QRhiTextureRenderTarget *)0x0) {
        local_218._44_4_ = 0xaaaaaaaa;
        local_218.m_texture = (QRhiTexture *)0x0;
        local_218.m_renderBuffer = (QRhiRenderBuffer *)0x0;
        local_218.m_layer = 0;
        local_218.m_level = 0;
        local_218.m_resolveTexture._0_4_ = 0;
        local_218.m_resolveTexture._4_4_ = 0;
        local_218.m_resolveLayer = 0;
        local_218.m_resolveLevel = 0;
        local_218.m_multiViewCount = 0;
        pQVar1 = this->colorTexture;
        if (this->colorTexture == (QRhiTexture *)0x0) {
          local_218.m_renderBuffer = this->msaaColorBuffer;
          pQVar1 = local_218.m_texture;
        }
        local_218.m_texture = pQVar1;
        if (1 < this->samples) {
          local_218.m_resolveTexture._0_4_ = SUB84(this->resolveTexture,0);
          local_218.m_resolveTexture._4_4_ = (undefined4)((ulong)this->resolveTexture >> 0x20);
        }
        memset((QRhiTextureRenderTargetDescription *)local_1e0,0xaa,0x1b8);
        QRhiTextureRenderTargetDescription::QRhiTextureRenderTargetDescription
                  ((QRhiTextureRenderTargetDescription *)local_1e0,&local_218,
                   this->depthStencilBuffer);
        pQVar6 = (QRhiTextureRenderTarget *)
                 QRhi::newTextureRenderTarget
                           (this->rhi,(QRhiTextureRenderTargetDescription *)local_1e0,0);
        this->renderTarget = pQVar6;
        pQVar7 = (QRhiRenderPassDescriptor *)(**(code **)(*(long *)pQVar6 + 0x38))(pQVar6);
        this->renderPassDescriptor = pQVar7;
        pQVar6 = this->renderTarget;
        *(QRhiRenderPassDescriptor **)(pQVar6 + 0x30) = pQVar7;
        cVar4 = (**(code **)(*(long *)pQVar6 + 0x40))();
        if (cVar4 == '\0') {
          invokeInitialize();
          goto LAB_002efad9;
        }
        if (local_1d0 != local_1c8) {
          QtPrivate::sizedFree(local_1d0,local_1e0[0] * 0x30);
        }
      }
    }
    else {
      resetRenderTargetObjects(this);
    }
    (**(code **)(*plVar2 + 0x1a0))(plVar2,cb);
    bVar9 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QRhiWidgetPrivate::invokeInitialize(QRhiCommandBuffer *cb)
{
    Q_Q(QRhiWidget);
    if (!colorTexture && !msaaColorBuffer)
        return false;

    if (autoRenderTarget) {
        const QSize pixelSize = colorTexture ? colorTexture->pixelSize() : msaaColorBuffer->pixelSize();
        if (!depthStencilBuffer) {
            depthStencilBuffer = rhi->newRenderBuffer(QRhiRenderBuffer::DepthStencil, pixelSize, samples);
            if (!depthStencilBuffer->create()) {
                qWarning("Failed to create depth-stencil buffer for QRhiWidget");
                resetRenderTargetObjects();
                return false;
            }
        } else if (depthStencilBuffer->pixelSize() != pixelSize) {
            depthStencilBuffer->setPixelSize(pixelSize);
            if (!depthStencilBuffer->create()) {
                qWarning("Failed to rebuild depth-stencil buffer for QRhiWidget with new size");
                return false;
            }
        }

        if (!renderTarget) {
            QRhiColorAttachment color0;
            if (colorTexture)
                color0.setTexture(colorTexture);
            else
                color0.setRenderBuffer(msaaColorBuffer);
            if (samples > 1)
                color0.setResolveTexture(resolveTexture);
            QRhiTextureRenderTargetDescription rtDesc(color0, depthStencilBuffer);
            renderTarget = rhi->newTextureRenderTarget(rtDesc);
            renderPassDescriptor = renderTarget->newCompatibleRenderPassDescriptor();
            renderTarget->setRenderPassDescriptor(renderPassDescriptor);
            if (!renderTarget->create()) {
                qWarning("Failed to create render target for QRhiWidget");
                resetRenderTargetObjects();
                return false;
            }
        }
    } else {
        resetRenderTargetObjects();
    }

    q->initialize(cb);

    return true;
}